

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int sx_strlen(char *str)

{
  int iVar1;
  int iVar2;
  uintptr_t uVar3;
  char *cp;
  uintptr_t lomagic;
  uintptr_t himagic;
  uintptr_t longword;
  uintptr_t *longword_ptr;
  char *char_ptr;
  char *str_local;
  
  for (longword_ptr = (uintptr_t *)str; iVar1 = (int)str, ((ulong)longword_ptr & 7) != 0;
      longword_ptr = (uintptr_t *)((long)longword_ptr + 1)) {
    if ((char)*longword_ptr == '\0') {
      return (int)longword_ptr - iVar1;
    }
  }
  longword = (uintptr_t)longword_ptr;
  uVar3 = longword;
  while( true ) {
    do {
      longword = uVar3;
      uVar3 = longword + 8;
    } while ((*(ulong *)longword + 0xfefefefefefefeff & (*(ulong *)longword ^ 0xffffffffffffffff) &
             0x8080808080808080) == 0);
    iVar2 = (int)longword;
    if (*(char *)longword == '\0') {
      return iVar2 - iVar1;
    }
    if (*(char *)(longword + 1) == '\0') {
      return (iVar2 - iVar1) + 1;
    }
    if (*(char *)(longword + 2) == '\0') {
      return (iVar2 - iVar1) + 2;
    }
    if (*(char *)(longword + 3) == '\0') {
      return (iVar2 - iVar1) + 3;
    }
    if (*(char *)(longword + 4) == '\0') {
      return (iVar2 - iVar1) + 4;
    }
    if (*(char *)(longword + 5) == '\0') {
      return (iVar2 - iVar1) + 5;
    }
    if (*(char *)(longword + 6) == '\0') break;
    if (*(char *)(longword + 7) == '\0') {
      return (iVar2 - iVar1) + 7;
    }
  }
  return (iVar2 - iVar1) + 6;
}

Assistant:

int sx_strlen(const char* str)
{
    const char* char_ptr;
    const uintptr_t* longword_ptr;
    uintptr_t longword, himagic, lomagic;

    for (char_ptr = str; ((uintptr_t)char_ptr & (sizeof(longword) - 1)) != 0; ++char_ptr) {
        if (*char_ptr == '\0')
            return (int)(intptr_t)(char_ptr - str);
    }
    longword_ptr = (uintptr_t*)char_ptr;
    himagic = 0x80808080L;
    lomagic = 0x01010101L;
#if SX_ARCH_64BIT
    /* 64-bit version of the magic.  */
    /* Do the shift in two steps to avoid a warning if long has 32 bits.  */
    himagic = ((himagic << 16) << 16) | himagic;
    lomagic = ((lomagic << 16) << 16) | lomagic;
#endif

    for (;;) {
        longword = *longword_ptr++;

        if (((longword - lomagic) & ~longword & himagic) != 0) {
            const char* cp = (const char*)(longword_ptr - 1);

            if (cp[0] == 0)
                return (int)(intptr_t)(cp - str);
            if (cp[1] == 0)
                return (int)(intptr_t)(cp - str + 1);
            if (cp[2] == 0)
                return (int)(intptr_t)(cp - str + 2);
            if (cp[3] == 0)
                return (int)(intptr_t)(cp - str + 3);
#if SX_ARCH_64BIT
            if (cp[4] == 0)
                return (int)(intptr_t)(cp - str + 4);
            if (cp[5] == 0)
                return (int)(intptr_t)(cp - str + 5);
            if (cp[6] == 0)
                return (int)(intptr_t)(cp - str + 6);
            if (cp[7] == 0)
                return (int)(intptr_t)(cp - str + 7);
#endif
        }
    }

    #if !SX_COMPILER_MSVC
    sx_assertf(0, "Not a null-terminated string");
    return -1;
    #endif
}